

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O1

void reset_monsters(void)

{
  wchar_t wVar1;
  monster *pmVar2;
  int iVar3;
  
  wVar1 = cave_monster_max(cave);
  if (L'\x01' < wVar1) {
    iVar3 = wVar1 + L'\x01';
    do {
      pmVar2 = cave_monster(cave,iVar3 + L'\xfffffffe');
      flag_off(pmVar2->mflag,2,9);
      iVar3 = iVar3 + -1;
    } while (2 < iVar3);
  }
  return;
}

Assistant:

void reset_monsters(void)
{
	int i;
	struct monster *mon;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		/* Access the monster */
		mon = cave_monster(cave, i);

		/* Monster is ready to go again */
		mflag_off(mon->mflag, MFLAG_HANDLED);
	}
}